

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::Texture3DLodControlCase::init
          (Texture3DLodControlCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  Texture3D *this_00;
  RenderContext *context;
  Texture3D *pTVar2;
  PixelBufferAccess *access;
  RGBA local_d8;
  Vector<float,_4> local_d4;
  Vector<float,_4> local_c4;
  Vec4 local_b4;
  uint local_a4;
  uint local_a0;
  deUint32 color;
  deUint32 rgb;
  deUint32 dec;
  deUint32 inc;
  deUint32 step;
  int levelNdx;
  int local_7c;
  float *pfStack_78;
  int numLevels;
  Vec4 *cBias;
  Vec4 *cScale;
  TextureFormatInfo fmtInfo;
  TextureFormat *texFmt;
  deUint32 format;
  Texture3DLodControlCase *this_local;
  
  fmtInfo.lookupBias.m_data._8_8_ = glu::mapGLInternalFormat(0x8058);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&cScale,(TextureFormat *)(fmtInfo.lookupBias.m_data + 2));
  cBias = (Vec4 *)(fmtInfo.valueMax.m_data + 2);
  pfStack_78 = fmtInfo.lookupScale.m_data + 2;
  iVar1 = de::max<int>(this->m_texWidth,this->m_texHeight);
  iVar1 = de::max<int>(iVar1,this->m_texDepth);
  local_7c = ::deLog2Floor32(iVar1);
  local_7c = local_7c + 1;
  this_00 = (Texture3D *)operator_new(0x70);
  context = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  glu::Texture3D::Texture3D
            (this_00,context,0x8058,this->m_texWidth,this->m_texHeight,this->m_texDepth);
  this->m_texture = this_00;
  for (inc = 0; (int)inc < local_7c; inc = inc + 1) {
    dec = (deUint32)(0xff / (long)(local_7c + -1));
    rgb = ::deClamp32(dec * inc,0,0xff);
    color = 0xff - rgb;
    local_a4 = rgb << 0x10 | color * 0x100;
    local_a0 = local_a4 | 0xff;
    local_a4 = local_a4 | 0xff0000ff;
    pTVar2 = glu::Texture3D::getRefTexture(this->m_texture);
    tcu::Texture3D::allocLevel(pTVar2,inc);
    pTVar2 = glu::Texture3D::getRefTexture(this->m_texture);
    access = tcu::TextureLevelPyramid::getLevel(&pTVar2->super_TextureLevelPyramid,inc);
    tcu::RGBA::RGBA(&local_d8,local_a4);
    tcu::RGBA::toVec((RGBA *)&local_d4);
    tcu::operator*((tcu *)&local_c4,&local_d4,cBias);
    tcu::operator+((tcu *)&local_b4,&local_c4,(Vector<float,_4> *)pfStack_78);
    tcu::clear(access,&local_b4);
  }
  glu::Texture3D::upload(this->m_texture);
  return extraout_EAX;
}

Assistant:

void Texture3DLodControlCase::init (void)
{
	const deUint32					format			= GL_RGBA8;
	const tcu::TextureFormat&		texFmt			= glu::mapGLInternalFormat(format);
	tcu::TextureFormatInfo			fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	const tcu::Vec4&				cScale			= fmtInfo.lookupScale;
	const tcu::Vec4&				cBias			= fmtInfo.lookupBias;
	int								numLevels		= deLog2Floor32(de::max(de::max(m_texWidth, m_texHeight), m_texDepth))+1;

	m_texture = new glu::Texture3D(m_context.getRenderContext(), format, m_texWidth, m_texHeight, m_texDepth);

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		deUint32	step		= 0xff / (numLevels-1);
		deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
		deUint32	dec			= 0xff - inc;
		deUint32	rgb			= (inc << 16) | (dec << 8) | 0xff;
		deUint32	color		= 0xff000000 | rgb;

		m_texture->getRefTexture().allocLevel(levelNdx);
		tcu::clear(m_texture->getRefTexture().getLevel(levelNdx), tcu::RGBA(color).toVec()*cScale + cBias);
	}

	m_texture->upload();
}